

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O3

void BN_consttime_swap(unsigned_long condition,BIGNUM *a,BIGNUM *b,int nwords)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar4 = 0xffffffffffffffff - ((long)(condition - 1) >> 0x3f);
  uVar5 = (uint)uVar4 & (b->top ^ a->top);
  a->top = a->top ^ uVar5;
  b->top = b->top ^ uVar5;
  switch(nwords) {
  case 1:
    puVar1 = a->d;
    puVar2 = b->d;
    goto LAB_00112e71;
  case 2:
    puVar1 = a->d;
    puVar2 = b->d;
    goto LAB_00112e58;
  case 3:
    puVar1 = a->d;
    puVar2 = b->d;
    goto LAB_00112e3f;
  case 4:
    puVar1 = a->d;
    puVar2 = b->d;
    goto LAB_00112e26;
  case 5:
    puVar1 = a->d;
    puVar2 = b->d;
    goto LAB_00112e0d;
  case 6:
    puVar1 = a->d;
    puVar2 = b->d;
    goto LAB_00112df4;
  case 7:
    puVar1 = a->d;
    puVar2 = b->d;
    goto LAB_00112ddb;
  case 8:
    puVar1 = a->d;
    puVar2 = b->d;
    goto LAB_00112dc2;
  case 9:
    puVar1 = a->d;
    puVar2 = b->d;
    goto LAB_00112da9;
  case 10:
    puVar1 = a->d;
    puVar2 = b->d;
    break;
  default:
    puVar1 = a->d;
    puVar2 = b->d;
    if (10 < nwords) {
      uVar3 = 10;
      do {
        uVar6 = (puVar2[uVar3] ^ puVar1[uVar3]) & uVar4;
        puVar1[uVar3] = puVar1[uVar3] ^ uVar6;
        puVar2[uVar3] = puVar2[uVar3] ^ uVar6;
        uVar3 = uVar3 + 1;
      } while ((uint)nwords != uVar3);
    }
  }
  uVar3 = (puVar2[9] ^ puVar1[9]) & uVar4;
  puVar1[9] = puVar1[9] ^ uVar3;
  puVar2[9] = puVar2[9] ^ uVar3;
LAB_00112da9:
  uVar3 = (puVar2[8] ^ puVar1[8]) & uVar4;
  puVar1[8] = puVar1[8] ^ uVar3;
  puVar2[8] = puVar2[8] ^ uVar3;
LAB_00112dc2:
  uVar3 = (puVar2[7] ^ puVar1[7]) & uVar4;
  puVar1[7] = puVar1[7] ^ uVar3;
  puVar2[7] = puVar2[7] ^ uVar3;
LAB_00112ddb:
  uVar3 = (puVar2[6] ^ puVar1[6]) & uVar4;
  puVar1[6] = puVar1[6] ^ uVar3;
  puVar2[6] = puVar2[6] ^ uVar3;
LAB_00112df4:
  uVar3 = (puVar2[5] ^ puVar1[5]) & uVar4;
  puVar1[5] = puVar1[5] ^ uVar3;
  puVar2[5] = puVar2[5] ^ uVar3;
LAB_00112e0d:
  uVar3 = (puVar2[4] ^ puVar1[4]) & uVar4;
  puVar1[4] = puVar1[4] ^ uVar3;
  puVar2[4] = puVar2[4] ^ uVar3;
LAB_00112e26:
  uVar3 = (puVar2[3] ^ puVar1[3]) & uVar4;
  puVar1[3] = puVar1[3] ^ uVar3;
  puVar2[3] = puVar2[3] ^ uVar3;
LAB_00112e3f:
  uVar3 = (puVar2[2] ^ puVar1[2]) & uVar4;
  puVar1[2] = puVar1[2] ^ uVar3;
  puVar2[2] = puVar2[2] ^ uVar3;
LAB_00112e58:
  uVar3 = (puVar2[1] ^ puVar1[1]) & uVar4;
  puVar1[1] = puVar1[1] ^ uVar3;
  puVar2[1] = puVar2[1] ^ uVar3;
LAB_00112e71:
  uVar4 = (*puVar2 ^ *puVar1) & uVar4;
  *puVar1 = *puVar1 ^ uVar4;
  *puVar2 = *puVar2 ^ uVar4;
  return;
}

Assistant:

void BN_consttime_swap(BN_ULONG condition, BIGNUM *a, BIGNUM *b, int nwords)
{
    BN_ULONG t;
    int i;

    bn_wcheck_size(a, nwords);
    bn_wcheck_size(b, nwords);

    assert(a != b);
    assert((condition & (condition - 1)) == 0);
    assert(sizeof(BN_ULONG) >= sizeof(int));

    condition = ((condition - 1) >> (BN_BITS2 - 1)) - 1;

    t = (a->top ^ b->top) & condition;
    a->top ^= t;
    b->top ^= t;

#define BN_CONSTTIME_SWAP(ind) \
        do { \
                t = (a->d[ind] ^ b->d[ind]) & condition; \
                a->d[ind] ^= t; \
                b->d[ind] ^= t; \
        } while (0)

    switch (nwords) {
    default:
        for (i = 10; i < nwords; i++)
            BN_CONSTTIME_SWAP(i);
        /* Fallthrough */
    case 10:
        BN_CONSTTIME_SWAP(9);   /* Fallthrough */
    case 9:
        BN_CONSTTIME_SWAP(8);   /* Fallthrough */
    case 8:
        BN_CONSTTIME_SWAP(7);   /* Fallthrough */
    case 7:
        BN_CONSTTIME_SWAP(6);   /* Fallthrough */
    case 6:
        BN_CONSTTIME_SWAP(5);   /* Fallthrough */
    case 5:
        BN_CONSTTIME_SWAP(4);   /* Fallthrough */
    case 4:
        BN_CONSTTIME_SWAP(3);   /* Fallthrough */
    case 3:
        BN_CONSTTIME_SWAP(2);   /* Fallthrough */
    case 2:
        BN_CONSTTIME_SWAP(1);   /* Fallthrough */
    case 1:
        BN_CONSTTIME_SWAP(0);
    }
#undef BN_CONSTTIME_SWAP
}